

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_node __thiscall pugi::xml_node::append_move(xml_node *this,xml_node *moved)

{
  ulong *puVar1;
  xml_node child;
  xml_node_struct *pxVar2;
  xml_node_struct *pxVar3;
  xml_node_struct *pxVar4;
  bool bVar5;
  xml_node xVar6;
  xml_node_struct **ppxVar7;
  xml_node_struct *pxVar8;
  
  xVar6 = (xml_node)this->_root;
  child = (xml_node)moved->_root;
  bVar5 = impl::anon_unknown_0::allow_move(xVar6,child);
  if (bVar5) {
    if (xVar6._root == (xml_node_struct *)0x0) {
      __assert_fail("object",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JeffIrwin[P]maph/submodules/colormapper/submodules/pugixml/src/pugixml.cpp"
                    ,0x486,
                    "xml_allocator &pugi::impl::(anonymous namespace)::get_allocator(const Object *) [Object = pugi::xml_node_struct]"
                   );
    }
    puVar1 = (ulong *)(*(long *)((long)xVar6._root - ((xVar6._root)->header >> 8)) + -0x40);
    *puVar1 = *puVar1 | 0x40;
    pxVar2 = (child._root)->parent;
    pxVar3 = (child._root)->prev_sibling_c;
    pxVar4 = (child._root)->next_sibling;
    pxVar8 = pxVar4;
    if (pxVar4 == (xml_node_struct *)0x0) {
      pxVar8 = pxVar2->first_child;
    }
    pxVar8->prev_sibling_c = pxVar3;
    ppxVar7 = &pxVar2->first_child;
    if (pxVar3->next_sibling != (xml_node_struct *)0x0) {
      ppxVar7 = &pxVar3->next_sibling;
    }
    *ppxVar7 = pxVar4;
    (child._root)->parent = (xml_node_struct *)0x0;
    (child._root)->prev_sibling_c = (xml_node_struct *)0x0;
    (child._root)->next_sibling = (xml_node_struct *)0x0;
    pxVar2 = moved->_root;
    pxVar3 = this->_root;
    pxVar2->parent = pxVar3;
    pxVar4 = pxVar3->first_child;
    if (pxVar4 == (xml_node_struct *)0x0) {
      pxVar3->first_child = pxVar2;
      pxVar4 = pxVar2;
    }
    else {
      pxVar3 = pxVar4->prev_sibling_c;
      pxVar3->next_sibling = pxVar2;
      pxVar2->prev_sibling_c = pxVar3;
    }
    pxVar4->prev_sibling_c = pxVar2;
    xVar6 = (xml_node)moved->_root;
  }
  else {
    xVar6._root = (xml_node_struct *)0x0;
  }
  return (xml_node)xVar6._root;
}

Assistant:

PUGI__FN xml_node xml_node::append_move(const xml_node& moved)
	{
		if (!impl::allow_move(*this, moved)) return xml_node();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_node();

		// disable document_buffer_order optimization since moving nodes around changes document order without changing buffer pointers
		impl::get_document(_root).header |= impl::xml_memory_page_contents_shared_mask;

		impl::remove_node(moved._root);
		impl::append_node(moved._root, _root);

		return moved;
	}